

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void CompressTables(lemon *lemp)

{
  state *psVar1;
  rule *prVar2;
  state *psVar3;
  bool bVar4;
  symbol *psVar5;
  action *paVar6;
  int iVar7;
  int iVar8;
  action *paVar9;
  long lVar10;
  rule *prVar11;
  
  if (0 < lemp->nstate) {
    lVar10 = 0;
    do {
      psVar1 = lemp->sorted[lVar10];
      paVar6 = psVar1->ap;
      if (paVar6 == (action *)0x0) {
        bVar4 = true;
        prVar11 = (rule *)0x0;
      }
      else {
        bVar4 = false;
        iVar7 = 0;
        prVar11 = (rule *)0x0;
        do {
          if ((paVar6->type == SHIFT) && (paVar6->sp == lemp->wildcard)) {
            bVar4 = true;
          }
          if (((paVar6->type == REDUCE) && (prVar2 = (rule *)(paVar6->x).stp, prVar2->lhsStart == 0)
              ) && (prVar2 != prVar11)) {
            iVar8 = 1;
            for (paVar9 = paVar6->next; paVar9 != (action *)0x0; paVar9 = paVar9->next) {
              if (paVar9->type == REDUCE) {
                iVar8 = iVar8 + (uint)((rule *)(paVar9->x).stp == prVar2 &&
                                      (rule *)(paVar9->x).stp != prVar11);
              }
            }
            if (iVar7 < iVar8) {
              prVar11 = prVar2;
              iVar7 = iVar8;
            }
          }
          paVar6 = paVar6->next;
        } while (paVar6 != (action *)0x0);
        bVar4 = bVar4 || iVar7 < 1;
      }
      if (!bVar4) {
        paVar6 = psVar1->ap;
        while( true ) {
          if (paVar6 == (action *)0x0) {
            __assert_fail("ap",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x11f3,"void CompressTables(struct lemon *)");
          }
          if ((paVar6->type == REDUCE) && ((rule *)(paVar6->x).stp == prVar11)) break;
          paVar6 = paVar6->next;
        }
        psVar5 = Symbol_new("{default}");
        paVar6->sp = psVar5;
        for (paVar6 = paVar6->next; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
          if ((paVar6->type == REDUCE) && ((rule *)(paVar6->x).stp == prVar11)) {
            paVar6->type = NOT_USED;
          }
        }
        paVar6 = (action *)msort(psVar1->ap,&psVar1->ap->next,actioncmp);
        psVar1->ap = paVar6;
        for (; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
          if (paVar6->type == REDUCE) {
            if ((rule *)(paVar6->x).stp != prVar11) goto LAB_0010825c;
          }
          else if (paVar6->type == SHIFT) goto LAB_0010825c;
        }
        psVar1->autoReduce = 1;
        psVar1->pDfltReduce = prVar11;
      }
LAB_0010825c:
      lVar10 = lVar10 + 1;
    } while (lVar10 < lemp->nstate);
  }
  if (0 < lemp->nstate) {
    lVar10 = 0;
    do {
      for (paVar6 = lemp->sorted[lVar10]->ap; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
        if (((paVar6->type == SHIFT) && (((paVar6->x).stp)->autoReduce != 0)) &&
           (prVar11 = ((paVar6->x).stp)->pDfltReduce, prVar11 != (rule *)0x0)) {
          paVar6->type = SHIFTREDUCE;
          (paVar6->x).stp = (state *)prVar11;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lemp->nstate);
  }
  if (0 < lemp->nstate) {
    lVar10 = 0;
    do {
      psVar1 = lemp->sorted[lVar10];
      paVar6 = psVar1->ap;
      while (paVar9 = paVar6, paVar9 != (action *)0x0) {
        paVar6 = paVar9->next;
        if (((paVar9->type == SHIFTREDUCE) &&
            (psVar3 = (paVar9->x).stp, *(int *)&psVar3[1].cfp != 0)) &&
           ((*(int *)&psVar3->ap == 1 && (lemp->nterminal <= paVar9->sp->index)))) {
          paVar6 = psVar1->ap;
          while( true ) {
            if (paVar6 == (action *)0x0) {
              __assert_fail("ap2!=0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                            ,0x122c,"void CompressTables(struct lemon *)");
            }
            if ((paVar6 != paVar9) && (paVar6->sp == (symbol *)psVar3->bp)) break;
            paVar6 = paVar6->next;
          }
          paVar9->spOpt = paVar6->sp;
          paVar9->type = paVar6->type;
          paVar9->x = paVar6->x;
          paVar6 = paVar9;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lemp->nstate);
  }
  return;
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2, *nextap;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }

    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possbile
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT ) break;
      if( ap->type==REDUCE && ap->x.rp!=rbest ) break;
    }
    if( ap==0 ){
      stp->autoReduce = 1;
      stp->pDfltReduce = rbest;
    }
  }

  /* Make a second pass over all states and actions.  Convert
  ** every action that is a SHIFT to an autoReduce state into
  ** a SHIFTREDUCE action.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=ap->next){
      struct state *pNextState;
      if( ap->type!=SHIFT ) continue;
      pNextState = ap->x.stp;
      if( pNextState->autoReduce && pNextState->pDfltReduce!=0 ){
        ap->type = SHIFTREDUCE;
        ap->x.rp = pNextState->pDfltReduce;
      }
    }
  }

  /* If a SHIFTREDUCE action specifies a rule that has a single RHS term
  ** (meaning that the SHIFTREDUCE will land back in the state where it
  ** started) and if there is no C-code associated with the reduce action,
  ** then we can go ahead and convert the action to be the same as the
  ** action for the RHS of the rule.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=nextap){
      nextap = ap->next;
      if( ap->type!=SHIFTREDUCE ) continue;
      rp = ap->x.rp;
      if( rp->noCode==0 ) continue;
      if( rp->nrhs!=1 ) continue;
#if 1
      /* Only apply this optimization to non-terminals.  It would be OK to
      ** apply it to terminal symbols too, but that makes the parser tables
      ** larger. */
      if( ap->sp->index<lemp->nterminal ) continue;
#endif
      /* If we reach this point, it means the optimization can be applied */
      nextap = ap;
      for(ap2=stp->ap; ap2 && (ap2==ap || ap2->sp!=rp->lhs); ap2=ap2->next){}
      assert( ap2!=0 );
      ap->spOpt = ap2->sp;
      ap->type = ap2->type;
      ap->x = ap2->x;
    }
  }
}